

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O1

compile_errcode __thiscall
SymbolTableTree::GetTermKind
          (SymbolTableTree *this,string *begin_func_name,string *name,SymbolKind *kind)

{
  pointer pcVar1;
  pointer ppVar2;
  size_t __n;
  undefined1 *__s2;
  size_t sVar3;
  int iVar4;
  compile_errcode cVar5;
  pointer ppVar6;
  string cur_func_name;
  undefined1 *local_80;
  size_t local_78;
  undefined1 local_70 [16];
  string *local_60;
  SymbolKind *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_80 = local_70;
  pcVar1 = (begin_func_name->_M_dataplus)._M_p;
  local_60 = begin_func_name;
  local_58 = kind;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + begin_func_name->_M_string_length);
  do {
    sVar3 = local_78;
    __s2 = local_80;
    ppVar6 = (this->m_table_tree).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->m_table_tree).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while ((ppVar6 != ppVar2 &&
           ((__n = (ppVar6->first)._M_string_length, __n != sVar3 ||
            ((__n != 0 && (iVar4 = bcmp((ppVar6->first)._M_dataplus._M_p,__s2,__n), iVar4 != 0))))))
          ) {
      ppVar6 = ppVar6 + 1;
    }
    cVar5 = SymbolTable::GetTermKind(&ppVar6->second,name,local_58);
    if (cVar5 == 0) {
      cVar5 = 0;
      goto LAB_001272d0;
    }
    pcVar1 = (ppVar6->second).m_previous_level_name._M_dataplus._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,
               pcVar1 + (ppVar6->second).m_previous_level_name._M_string_length);
    std::__cxx11::string::operator=((string *)&local_80,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  } while ((local_78 != (this->m_BOTTOM_LEVEL)._M_string_length) ||
          ((local_78 != 0 &&
           (iVar4 = bcmp(local_80,(this->m_BOTTOM_LEVEL)._M_dataplus._M_p,local_78), iVar4 != 0))));
  fprintf(_stderr,"(kind)no match term name: %s---%s\n",(local_60->_M_dataplus)._M_p,
          (name->_M_dataplus)._M_p);
  cVar5 = -3;
LAB_001272d0:
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  return cVar5;
}

Assistant:

compile_errcode SymbolTableTree::GetTermKind(const string& begin_func_name, const string& name, SymbolKind& kind) {
    int ret = COMPILE_OK;
    string cur_func_name = begin_func_name;
    do {
        auto iter = m_table_tree.begin(); 
        for (; iter != m_table_tree.end(); ++iter) {
            if (iter->first == cur_func_name) {
                break;
            }
        }
        if ((ret = iter->second.GetTermKind(name, kind)) != COMPILE_OK) {
            cur_func_name = iter->second.GetPreviousTableName();
        } else {
            return COMPILE_OK;
        }
    } while(cur_func_name != m_BOTTOM_LEVEL);
    fprintf(stderr, "(kind)no match term name: %s---%s\n", begin_func_name.c_str(), name.c_str());
    return NOT_FIND_TERM;
}